

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O3

bool __thiscall ON_BoundingBox::Intersection(ON_BoundingBox *this,ON_BoundingBox *a)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  
  bVar7 = IsNotEmpty(this);
  if (bVar7) {
    bVar7 = IsNotEmpty(a);
    if (bVar7) {
      dVar2 = (a->m_min).x;
      if ((this->m_min).x <= dVar2 && dVar2 != (this->m_min).x) {
        (this->m_min).x = dVar2;
      }
      dVar2 = (a->m_min).y;
      pdVar1 = &(this->m_min).y;
      if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
        (this->m_min).y = dVar2;
      }
      dVar2 = (a->m_min).z;
      pdVar1 = &(this->m_min).z;
      if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
        (this->m_min).z = dVar2;
      }
      dVar2 = (a->m_max).x;
      if (dVar2 < (this->m_max).x) {
        (this->m_max).x = dVar2;
      }
      dVar2 = (a->m_max).y;
      if (dVar2 < (this->m_max).y) {
        (this->m_max).y = dVar2;
      }
      dVar2 = (a->m_max).z;
      if (dVar2 < (this->m_max).z) {
        (this->m_max).z = dVar2;
      }
      goto LAB_003dfc5d;
    }
  }
  dVar6 = EmptyBoundingBox.m_max.z;
  dVar5 = EmptyBoundingBox.m_max.x;
  dVar4 = EmptyBoundingBox.m_min.z;
  dVar3 = EmptyBoundingBox.m_min.y;
  dVar2 = EmptyBoundingBox.m_min.x;
  (this->m_max).y = EmptyBoundingBox.m_max.y;
  (this->m_max).z = dVar6;
  (this->m_min).z = dVar4;
  (this->m_max).x = dVar5;
  (this->m_min).x = dVar2;
  (this->m_min).y = dVar3;
LAB_003dfc5d:
  bVar7 = IsNotEmpty(this);
  return bVar7;
}

Assistant:

bool ON_BoundingBox::Intersection(
          const ON_BoundingBox& a
          )
{
  if ( IsValid() && a.IsValid() ) {
    if ( a.m_min.x > m_min.x )
      m_min.x = a.m_min.x;
    if ( a.m_min.y > m_min.y )
      m_min.y = a.m_min.y;
    if ( a.m_min.z > m_min.z )
      m_min.z = a.m_min.z;
    if ( a.m_max.x < m_max.x )
      m_max.x = a.m_max.x;
    if ( a.m_max.y < m_max.y )
      m_max.y = a.m_max.y;
    if ( a.m_max.z < m_max.z )
      m_max.z = a.m_max.z;
  }
  else {
    Destroy();
  }
  return IsValid();
}